

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMRangeImpl.cpp
# Opt level: O0

DOMNode * __thiscall
xercesc_4_0::DOMRangeImpl::traverseNode
          (DOMRangeImpl *this,DOMNode *n,bool isFullySelected,bool isLeft,int how)

{
  short sVar1;
  int iVar2;
  short type;
  int how_local;
  bool isLeft_local;
  bool isFullySelected_local;
  DOMNode *n_local;
  DOMRangeImpl *this_local;
  
  if (isFullySelected) {
    this_local = (DOMRangeImpl *)traverseFullySelected(this,n,how);
  }
  else {
    iVar2 = (*n->_vptr_DOMNode[4])();
    sVar1 = (short)iVar2;
    if ((((sVar1 == 3) || (sVar1 == 4)) || (sVar1 == 8)) || (sVar1 == 7)) {
      this_local = (DOMRangeImpl *)traverseTextNode(this,n,isLeft,how);
    }
    else {
      this_local = (DOMRangeImpl *)traversePartiallySelected(this,n,how);
    }
  }
  return (DOMNode *)this_local;
}

Assistant:

DOMNode* DOMRangeImpl::traverseNode( DOMNode* n, bool isFullySelected, bool isLeft, int how )
{
    if ( isFullySelected )
        return traverseFullySelected( n, how );

    short type = n->getNodeType();

    if((type == DOMNode::TEXT_NODE
        || type == DOMNode::CDATA_SECTION_NODE
        || type == DOMNode::COMMENT_NODE
        || type == DOMNode::PROCESSING_INSTRUCTION_NODE))
        return traverseTextNode( n, isLeft, how );

    return traversePartiallySelected( n, how );
}